

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::BinaryReaderObjdumpDisassemble::OnLocalDecl
          (BinaryReaderObjdumpDisassemble *this,Index decl_index,Index count,Type type)

{
  Offset OVar1;
  string local_68;
  ulong local_48;
  size_t i_1;
  size_t i;
  size_t data_size;
  Offset offset;
  Index count_local;
  Index decl_index_local;
  BinaryReaderObjdumpDisassemble *this_local;
  Type type_local;
  
  offset._0_4_ = count;
  offset._4_4_ = decl_index;
  _count_local = this;
  unique0x1000027b = type;
  if ((this->in_function_body & 1U) == 0) {
    Result::Result((Result *)&type_local,Ok);
  }
  else {
    data_size = this->current_opcode_offset;
    i = ((this->super_BinaryReaderObjdumpBase).super_BinaryReaderNop.super_BinaryReaderDelegate.
        state)->offset - data_size;
    OVar1 = anon_unknown_16::BinaryReaderObjdumpBase::GetPrintOffset
                      (&this->super_BinaryReaderObjdumpBase,data_size);
    printf(" %06zx:",OVar1);
    for (i_1 = 0; i_1 < i && i_1 < 9; i_1 = i_1 + 1) {
      printf(" %02x",(ulong)(this->super_BinaryReaderObjdumpBase).data_[data_size]);
      data_size = data_size + 1;
    }
    for (local_48 = i; local_48 < 9; local_48 = local_48 + 1) {
      printf("   ");
    }
    printf(" | local[");
    if ((Index)offset != 0) {
      printf("%u",(ulong)this->local_index_);
      if ((Index)offset != 1) {
        printf("..%u",(ulong)((this->local_index_ + (Index)offset) - 1));
      }
      this->local_index_ = (Index)offset + this->local_index_;
    }
    Type::GetName_abi_cxx11_(&local_68,(Type *)((long)&this_local + 4));
    std::__cxx11::string::c_str();
    printf("] type=%s\n");
    std::__cxx11::string::~string((string *)&local_68);
    this->last_opcode_end = this->current_opcode_offset + i;
    this->current_opcode_offset = this->last_opcode_end;
    Result::Result((Result *)&type_local,Ok);
  }
  return (Result)type_local.enum_;
}

Assistant:

Result BinaryReaderObjdumpDisassemble::OnLocalDecl(Index decl_index,
                                                   Index count,
                                                   Type type) {
  if (!in_function_body) {
    return Result::Ok;
  }
  Offset offset = current_opcode_offset;
  size_t data_size = state->offset - offset;

  printf(" %06" PRIzx ":", GetPrintOffset(offset));
  for (size_t i = 0; i < data_size && i < IMMEDIATE_OCTET_COUNT;
       i++, offset++) {
    printf(" %02x", data_[offset]);
  }
  for (size_t i = data_size; i < IMMEDIATE_OCTET_COUNT; i++) {
    printf("   ");
  }
  printf(" | local[");
  if (count > 0) {
    printf("%" PRIindex, local_index_);

    if (count != 1) {
      printf("..%" PRIindex "", local_index_ + count - 1);
    }
    local_index_ += count;
  }
  printf("] type=%s\n", type.GetName().c_str());

  last_opcode_end = current_opcode_offset + data_size;
  current_opcode_offset = last_opcode_end;

  return Result::Ok;
}